

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::condition_error>_>::clone_impl
          (clone_impl<boost::exception_detail::error_info_injector<boost::condition_error>_> *this,
          error_info_injector<boost::condition_error> *x)

{
  *(undefined ***)&this->field_0x68 = &PTR___cxa_pure_virtual_001e2098;
  error_info_injector<boost::condition_error>::error_info_injector
            (&this->super_error_info_injector<boost::condition_error>,x);
  *(undefined8 *)
   &(this->super_error_info_injector<boost::condition_error>).super_condition_error.
    super_system_error = 0x1e39f0;
  (this->super_error_info_injector<boost::condition_error>).super_exception._vptr_exception =
       (_func_int **)0x1e3a28;
  *(undefined8 *)&this->field_0x68 = 0x1e3a60;
  copy_boost_exception
            (&(this->super_error_info_injector<boost::condition_error>).super_exception,
             &x->super_exception);
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }